

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::ArrayBuilder<unsigned_int>::~ArrayBuilder(ArrayBuilder<unsigned_int> *this)

{
  uint *puVar1;
  RemoveConst<unsigned_int> *pRVar2;
  uint *puVar3;
  
  puVar1 = this->ptr;
  if (puVar1 != (uint *)0x0) {
    pRVar2 = this->pos;
    puVar3 = this->endPtr;
    this->ptr = (uint *)0x0;
    this->pos = (RemoveConst<unsigned_int> *)0x0;
    this->endPtr = (uint *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,puVar1,4,(long)pRVar2 - (long)puVar1 >> 2,
               (long)puVar3 - (long)puVar1 >> 2,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }